

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarAddTab(ImGuiTabBar *tab_bar,ImGuiTabItemFlags tab_flags,ImGuiWindow *window)

{
  bool bVar1;
  ImGuiID IVar2;
  ImGuiTabItem *pIVar3;
  uint uVar4;
  int iVar5;
  ImGuiTabItem *__dest;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  IVar2 = window->ID;
  if ((IVar2 != 0) && (lVar7 = (long)(tab_bar->Tabs).Size, 0 < lVar7)) {
    lVar9 = 0;
    do {
      if (*(ImGuiID *)((long)&((tab_bar->Tabs).Data)->ID + lVar9) == IVar2) {
        __assert_fail("TabBarFindTabByID(tab_bar, window->ID) == __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                      ,0x1da5,
                      "void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)");
      }
      lVar9 = lVar9 + 0x30;
    } while (lVar7 * 0x30 != lVar9);
  }
  if (GImGui->CurrentTabBar != tab_bar) {
    iVar10 = tab_bar->CurrFrameVisible;
    if (iVar10 == -1) {
      iVar10 = GImGui->FrameCount + -1;
    }
    bVar1 = window->HasCloseButton;
    iVar5 = (tab_bar->Tabs).Size;
    if (iVar5 == (tab_bar->Tabs).Capacity) {
      if (iVar5 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar5 / 2 + iVar5;
      }
      iVar8 = iVar5 + 1;
      if (iVar5 + 1 < iVar6) {
        iVar8 = iVar6;
      }
      __dest = (ImGuiTabItem *)MemAlloc((long)iVar8 * 0x30);
      pIVar3 = (tab_bar->Tabs).Data;
      if (pIVar3 != (ImGuiTabItem *)0x0) {
        memcpy(__dest,pIVar3,(long)(tab_bar->Tabs).Size * 0x30);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = __dest;
      (tab_bar->Tabs).Capacity = iVar8;
      iVar5 = (tab_bar->Tabs).Size;
    }
    else {
      __dest = (tab_bar->Tabs).Data;
    }
    uVar4 = tab_flags | 0x100000;
    if (bVar1 != false) {
      uVar4 = tab_flags;
    }
    __dest[iVar5].ID = IVar2;
    __dest[iVar5].Flags = uVar4;
    __dest[iVar5].Window = window;
    __dest[iVar5].LastFrameVisible = iVar10;
    __dest[iVar5].LastFrameSelected = -1;
    __dest[iVar5].ContentWidth = 0.0;
    __dest[iVar5].Offset = 0.0;
    __dest[iVar5].Width = 0.0;
    pIVar3 = __dest + iVar5;
    pIVar3->NameOffset = -1;
    pIVar3->BeginOrder = -1;
    pIVar3->IndexDuringLayout = -1;
    *(undefined4 *)&__dest[iVar5].WantClose = 0;
    (tab_bar->Tabs).Size = (tab_bar->Tabs).Size + 1;
    return;
  }
  __assert_fail("g.CurrentTabBar != tab_bar",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                ,0x1da6,"void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)")
  ;
}

Assistant:

void ImGui::TabBarAddTab(ImGuiTabBar* tab_bar, ImGuiTabItemFlags tab_flags, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(TabBarFindTabByID(tab_bar, window->ID) == NULL);
    IM_ASSERT(g.CurrentTabBar != tab_bar);  // Can't work while the tab bar is active as our tab doesn't have an X offset yet, in theory we could/should test something like (tab_bar->CurrFrameVisible < g.FrameCount) but we'd need to solve why triggers the commented early-out assert in BeginTabBarEx() (probably dock node going from implicit to explicit in same frame)

    if (!window->HasCloseButton)
        tab_flags |= ImGuiTabItemFlags_NoCloseButton;       // Set _NoCloseButton immediately because it will be used for first-frame width calculation.

    ImGuiTabItem new_tab;
    new_tab.ID = window->ID;
    new_tab.Flags = tab_flags;
    new_tab.LastFrameVisible = tab_bar->CurrFrameVisible;   // Required so BeginTabBar() doesn't ditch the tab
    if (new_tab.LastFrameVisible == -1)
        new_tab.LastFrameVisible = g.FrameCount - 1;
    new_tab.Window = window;                                // Required so tab bar layout can compute the tab width before tab submission
    tab_bar->Tabs.push_back(new_tab);
}